

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void us16_to_us32_test(int line,UTF_US16 *str1,UTF_US32 *str2,bool ok)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  UTF_UC32 *pUVar6;
  pointer pcVar7;
  UTF_UC32 uc32;
  UTF_US32 tmp;
  UTF_UC32 buf [256];
  UTF_UC32 local_460;
  char16_t local_45c;
  char16_t local_45a;
  UTF_US32 local_458;
  UTF_UC32 local_438 [258];
  
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  local_458._M_string_length = 0;
  local_458.field_2._M_local_buf[0] = L'\0';
  bVar1 = UTF_u_to_U<(char)63>(str1,&local_458);
  UTF_test(line,bVar1 == ok);
  bVar1 = std::operator==(&local_458,str2);
  UTF_test(line,bVar1);
  pcVar7 = (str1->_M_dataplus)._M_p;
  pcVar4 = pcVar7 + str1->_M_string_length;
  lVar5 = 0x3fc;
  pUVar6 = local_438;
  do {
    bVar1 = pcVar7 == pcVar4;
    if (bVar1) {
LAB_00101a34:
      *pUVar6 = L'\0';
      UTF_test(line,bVar1);
      iVar3 = UTF_uj32_cmpn(local_458._M_dataplus._M_p,local_438,local_458._M_string_length + 1);
      UTF_test(line,iVar3 == 0);
      std::__cxx11::u32string::~u32string((u32string *)&local_458);
      return;
    }
    local_45c = *pcVar7;
    if ((local_45c & 0xfc00U) == 0xd800) {
      pcVar7 = pcVar7 + 1;
      if (pcVar7 == pcVar4) {
        if (lVar5 == 0) {
          bVar1 = false;
        }
        else {
          *pUVar6 = L'?';
          pUVar6 = pUVar6 + 1;
          bVar1 = true;
        }
        goto LAB_00101a34;
      }
      local_45a = *pcVar7;
    }
    else {
      local_45a = L'\0';
    }
    bVar2 = UTF_uc16_to_uc32(&local_45c,&local_460);
    if (!bVar2) {
      local_460 = L'?';
    }
    if (lVar5 == 0) goto LAB_00101a34;
    *pUVar6 = local_460;
    pcVar7 = pcVar7 + 1;
    lVar5 = lVar5 + -4;
    pUVar6 = pUVar6 + 1;
  } while( true );
}

Assistant:

void us16_to_us32_test(int line, const UTF_US16& str1, const UTF_US32& str2, bool ok)
{
    UTF_US32 tmp;
    UTF_UC32 buf[256];
    UTF_test(line, UTF_u_to_U<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_uj16_to_uj32(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj32_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}